

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O3

int g_iofile(lua_State *L,char *f,char *mode)

{
  int iVar1;
  char *fname;
  
  iVar1 = lua_type(L,1);
  if (0 < iVar1) {
    fname = lua_tolstring(L,1,(size_t *)0x0);
    if (fname == (char *)0x0) {
      tofile(L);
      lua_pushvalue(L,1);
    }
    else {
      opencheck(L,fname,mode);
    }
    lua_setfield(L,-0xf4628,f);
  }
  iVar1 = lua_getfield(L,-0xf4628,f);
  return iVar1;
}

Assistant:

static int g_iofile(lua_State *L, const char *f, const char *mode) {
    if (!lua_isnoneornil(L, 1)) {
        const char *filename = lua_tostring(L, 1);
        if (filename)
            opencheck(L, filename, mode);
        else {
            tofile(L);  /* check that it's a valid file handle */
            lua_pushvalue(L, 1);
        }
        lua_setfield(L, LUA_REGISTRYINDEX, f);
    }
    /* return current value */
    lua_getfield(L, LUA_REGISTRYINDEX, f);
    return 1;
}